

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::fixAfterChanges(wasm::Function*)::Fixer::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  Id IVar1;
  uint uVar2;
  Block *pBVar3;
  BrOn *pBVar4;
  Break *pBVar5;
  Switch *pSVar6;
  Name *name;
  Try *pTVar7;
  anon_class_8_1_8991fb9c local_30;
  
  IVar1 = curr->_id;
  local_30.this = (Fixer *)this;
  switch(IVar1) {
  case InvalidId:
  case NumExpressionIds:
    goto switchD_0013f111_caseD_0;
  case BlockId:
    pBVar3 = Expression::cast<wasm::Block>(curr);
    goto LAB_0013f482;
  case IfId:
    Expression::cast<wasm::If>(curr);
    break;
  case LoopId:
    pBVar3 = (Block *)Expression::cast<wasm::Loop>(curr);
    goto LAB_0013f482;
  case BreakId:
    Expression::cast<wasm::Break>(curr);
    break;
  case SwitchId:
    Expression::cast<wasm::Switch>(curr);
    break;
  case CallId:
    Expression::cast<wasm::Call>(curr);
    break;
  case CallIndirectId:
    Expression::cast<wasm::CallIndirect>(curr);
    break;
  case LocalGetId:
    Expression::cast<wasm::LocalGet>(curr);
    break;
  case LocalSetId:
    Expression::cast<wasm::LocalSet>(curr);
    break;
  case GlobalGetId:
    Expression::cast<wasm::GlobalGet>(curr);
    break;
  case GlobalSetId:
    Expression::cast<wasm::GlobalSet>(curr);
    break;
  case LoadId:
    Expression::cast<wasm::Load>(curr);
    break;
  case StoreId:
    Expression::cast<wasm::Store>(curr);
    break;
  case ConstId:
    Expression::cast<wasm::Const>(curr);
    break;
  case UnaryId:
    Expression::cast<wasm::Unary>(curr);
    break;
  case BinaryId:
    Expression::cast<wasm::Binary>(curr);
    break;
  case SelectId:
    Expression::cast<wasm::Select>(curr);
    break;
  case DropId:
    Expression::cast<wasm::Drop>(curr);
    break;
  case ReturnId:
    Expression::cast<wasm::Return>(curr);
    break;
  case MemorySizeId:
    Expression::cast<wasm::MemorySize>(curr);
    break;
  case MemoryGrowId:
    Expression::cast<wasm::MemoryGrow>(curr);
    break;
  case NopId:
    Expression::cast<wasm::Nop>(curr);
    break;
  case UnreachableId:
    Expression::cast<wasm::Unreachable>(curr);
    break;
  case AtomicRMWId:
    Expression::cast<wasm::AtomicRMW>(curr);
    break;
  case AtomicCmpxchgId:
    Expression::cast<wasm::AtomicCmpxchg>(curr);
    break;
  case AtomicWaitId:
    Expression::cast<wasm::AtomicWait>(curr);
    break;
  case AtomicNotifyId:
    Expression::cast<wasm::AtomicNotify>(curr);
    break;
  case AtomicFenceId:
    Expression::cast<wasm::AtomicFence>(curr);
    break;
  case SIMDExtractId:
    Expression::cast<wasm::SIMDExtract>(curr);
    break;
  case SIMDReplaceId:
    Expression::cast<wasm::SIMDReplace>(curr);
    break;
  case SIMDShuffleId:
    Expression::cast<wasm::SIMDShuffle>(curr);
    break;
  case SIMDTernaryId:
    Expression::cast<wasm::SIMDTernary>(curr);
    break;
  case SIMDShiftId:
    Expression::cast<wasm::SIMDShift>(curr);
    break;
  case SIMDLoadId:
    Expression::cast<wasm::SIMDLoad>(curr);
    break;
  case SIMDLoadStoreLaneId:
    Expression::cast<wasm::SIMDLoadStoreLane>(curr);
    break;
  case MemoryInitId:
    Expression::cast<wasm::MemoryInit>(curr);
    break;
  case DataDropId:
    Expression::cast<wasm::DataDrop>(curr);
    break;
  case MemoryCopyId:
    Expression::cast<wasm::MemoryCopy>(curr);
    break;
  case MemoryFillId:
    Expression::cast<wasm::MemoryFill>(curr);
    break;
  case PopId:
    Expression::cast<wasm::Pop>(curr);
    break;
  case RefNullId:
    Expression::cast<wasm::RefNull>(curr);
    break;
  case RefIsNullId:
    Expression::cast<wasm::RefIsNull>(curr);
    break;
  case RefFuncId:
    Expression::cast<wasm::RefFunc>(curr);
    break;
  case RefEqId:
    Expression::cast<wasm::RefEq>(curr);
    break;
  case TableGetId:
    Expression::cast<wasm::TableGet>(curr);
    break;
  case TableSetId:
    Expression::cast<wasm::TableSet>(curr);
    break;
  case TableSizeId:
    Expression::cast<wasm::TableSize>(curr);
    break;
  case TableGrowId:
    Expression::cast<wasm::TableGrow>(curr);
    break;
  case TryId:
    pBVar3 = (Block *)Expression::cast<wasm::Try>(curr);
LAB_0013f482:
    fixAfterChanges::Fixer::visitExpression::anon_class_8_1_8991fb9c::operator()
              (&local_30,&pBVar3->name);
    break;
  case ThrowId:
    Expression::cast<wasm::Throw>(curr);
    break;
  case RethrowId:
    Expression::cast<wasm::Rethrow>(curr);
    break;
  case TupleMakeId:
    Expression::cast<wasm::TupleMake>(curr);
    break;
  case TupleExtractId:
    Expression::cast<wasm::TupleExtract>(curr);
    break;
  case I31NewId:
    Expression::cast<wasm::I31New>(curr);
    break;
  case I31GetId:
    Expression::cast<wasm::I31Get>(curr);
    break;
  case CallRefId:
    Expression::cast<wasm::CallRef>(curr);
    break;
  case RefTestId:
    Expression::cast<wasm::RefTest>(curr);
    break;
  case RefCastId:
    Expression::cast<wasm::RefCast>(curr);
    break;
  case BrOnId:
    Expression::cast<wasm::BrOn>(curr);
    break;
  case StructNewId:
    Expression::cast<wasm::StructNew>(curr);
    break;
  case StructGetId:
    Expression::cast<wasm::StructGet>(curr);
    break;
  case StructSetId:
    Expression::cast<wasm::StructSet>(curr);
    break;
  case ArrayNewId:
    Expression::cast<wasm::ArrayNew>(curr);
    break;
  case ArrayNewSegId:
    Expression::cast<wasm::ArrayNewSeg>(curr);
    break;
  case ArrayNewFixedId:
    Expression::cast<wasm::ArrayNewFixed>(curr);
    break;
  case ArrayGetId:
    Expression::cast<wasm::ArrayGet>(curr);
    break;
  case ArraySetId:
    Expression::cast<wasm::ArraySet>(curr);
    break;
  case ArrayLenId:
    Expression::cast<wasm::ArrayLen>(curr);
    break;
  case ArrayCopyId:
    Expression::cast<wasm::ArrayCopy>(curr);
    break;
  case ArrayFillId:
    Expression::cast<wasm::ArrayFill>(curr);
    break;
  case ArrayInitId:
    Expression::cast<wasm::ArrayInit>(curr);
    break;
  case RefAsId:
    Expression::cast<wasm::RefAs>(curr);
    break;
  case StringNewId:
    Expression::cast<wasm::StringNew>(curr);
    break;
  case StringConstId:
    Expression::cast<wasm::StringConst>(curr);
    break;
  case StringMeasureId:
    Expression::cast<wasm::StringMeasure>(curr);
    break;
  case StringEncodeId:
    Expression::cast<wasm::StringEncode>(curr);
    break;
  case StringConcatId:
    Expression::cast<wasm::StringConcat>(curr);
    break;
  case StringEqId:
    Expression::cast<wasm::StringEq>(curr);
    break;
  case StringAsId:
    Expression::cast<wasm::StringAs>(curr);
    break;
  case StringWTF8AdvanceId:
    Expression::cast<wasm::StringWTF8Advance>(curr);
    break;
  case StringWTF16GetId:
    Expression::cast<wasm::StringWTF16Get>(curr);
    break;
  case StringIterNextId:
    Expression::cast<wasm::StringIterNext>(curr);
    break;
  case StringIterMoveId:
    Expression::cast<wasm::StringIterMove>(curr);
    break;
  case StringSliceWTFId:
    Expression::cast<wasm::StringSliceWTF>(curr);
    break;
  case StringSliceIterId:
    Expression::cast<wasm::StringSliceIter>(curr);
    break;
  default:
    goto switchD_0013f111_default;
  }
  IVar1 = curr->_id;
switchD_0013f111_default:
  switch(IVar1) {
  case InvalidId:
  case NumExpressionIds:
switchD_0013f111_caseD_0:
    local_30.this = (Fixer *)this;
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
               ,0xb0);
  case BlockId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Block>(curr);
    return;
  case IfId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::If>(curr);
    return;
  case LoopId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Loop>(curr);
    return;
  case BreakId:
    local_30.this = (Fixer *)this;
    pBVar5 = Expression::cast<wasm::Break>(curr);
    goto LAB_0013f93b;
  case SwitchId:
    local_30.this = (Fixer *)this;
    pSVar6 = Expression::cast<wasm::Switch>(curr);
    fixAfterChanges::Fixer::visitExpression::anon_class_8_1_8991fb9c::operator()
              (&local_30,&pSVar6->default_);
    for (uVar2 = 0;
        (ulong)uVar2 <
        (pSVar6->targets).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements;
        uVar2 = uVar2 + 1) {
      name = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(pSVar6->targets).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,(ulong)uVar2);
      fixAfterChanges::Fixer::visitExpression::anon_class_8_1_8991fb9c::operator()(&local_30,name);
    }
    return;
  case CallId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Call>(curr);
    return;
  case CallIndirectId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::CallIndirect>(curr);
    return;
  case LocalGetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::LocalGet>(curr);
    return;
  case LocalSetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::LocalSet>(curr);
    return;
  case GlobalGetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::GlobalGet>(curr);
    return;
  case GlobalSetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::GlobalSet>(curr);
    return;
  case LoadId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Load>(curr);
    return;
  case StoreId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Store>(curr);
    return;
  case ConstId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Const>(curr);
    return;
  case UnaryId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Unary>(curr);
    return;
  case BinaryId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Binary>(curr);
    return;
  case SelectId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Select>(curr);
    return;
  case DropId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Drop>(curr);
    return;
  case ReturnId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Return>(curr);
    return;
  case MemorySizeId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::MemorySize>(curr);
    return;
  case MemoryGrowId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::MemoryGrow>(curr);
    return;
  case NopId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Nop>(curr);
    return;
  case UnreachableId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Unreachable>(curr);
    return;
  case AtomicRMWId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::AtomicRMW>(curr);
    return;
  case AtomicCmpxchgId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::AtomicCmpxchg>(curr);
    return;
  case AtomicWaitId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::AtomicWait>(curr);
    return;
  case AtomicNotifyId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::AtomicNotify>(curr);
    return;
  case AtomicFenceId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::AtomicFence>(curr);
    return;
  case SIMDExtractId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::SIMDExtract>(curr);
    return;
  case SIMDReplaceId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::SIMDReplace>(curr);
    return;
  case SIMDShuffleId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::SIMDShuffle>(curr);
    return;
  case SIMDTernaryId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::SIMDTernary>(curr);
    return;
  case SIMDShiftId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::SIMDShift>(curr);
    return;
  case SIMDLoadId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::SIMDLoad>(curr);
    return;
  case SIMDLoadStoreLaneId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::SIMDLoadStoreLane>(curr);
    return;
  case MemoryInitId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::MemoryInit>(curr);
    return;
  case DataDropId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::DataDrop>(curr);
    return;
  case MemoryCopyId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::MemoryCopy>(curr);
    return;
  case MemoryFillId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::MemoryFill>(curr);
    return;
  case PopId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Pop>(curr);
    return;
  case RefNullId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::RefNull>(curr);
    return;
  case RefIsNullId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::RefIsNull>(curr);
    return;
  case RefFuncId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::RefFunc>(curr);
    return;
  case RefEqId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::RefEq>(curr);
    return;
  case TableGetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::TableGet>(curr);
    return;
  case TableSetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::TableSet>(curr);
    return;
  case TableSizeId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::TableSize>(curr);
    return;
  case TableGrowId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::TableGrow>(curr);
    return;
  case TryId:
    local_30.this = (Fixer *)this;
    pTVar7 = Expression::cast<wasm::Try>(curr);
    pBVar4 = (BrOn *)(pTVar7 + 0x68);
    break;
  case ThrowId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::Throw>(curr);
    return;
  case RethrowId:
    local_30.this = (Fixer *)this;
    pBVar5 = (Break *)Expression::cast<wasm::Rethrow>(curr);
LAB_0013f93b:
    pBVar4 = (BrOn *)&pBVar5->name;
    break;
  case TupleMakeId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::TupleMake>(curr);
    return;
  case TupleExtractId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::TupleExtract>(curr);
    return;
  case I31NewId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::I31New>(curr);
    return;
  case I31GetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::I31Get>(curr);
    return;
  case CallRefId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::CallRef>(curr);
    return;
  case RefTestId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::RefTest>(curr);
    return;
  case RefCastId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::RefCast>(curr);
    return;
  case BrOnId:
    local_30.this = (Fixer *)this;
    pBVar4 = Expression::cast<wasm::BrOn>(curr);
    pBVar4 = pBVar4 + 0x18;
    break;
  case StructNewId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StructNew>(curr);
    return;
  case StructGetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StructGet>(curr);
    return;
  case StructSetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StructSet>(curr);
    return;
  case ArrayNewId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArrayNew>(curr);
    return;
  case ArrayNewSegId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArrayNewSeg>(curr);
    return;
  case ArrayNewFixedId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArrayNewFixed>(curr);
    return;
  case ArrayGetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArrayGet>(curr);
    return;
  case ArraySetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArraySet>(curr);
    return;
  case ArrayLenId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArrayLen>(curr);
    return;
  case ArrayCopyId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArrayCopy>(curr);
    return;
  case ArrayFillId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArrayFill>(curr);
    return;
  case ArrayInitId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::ArrayInit>(curr);
    return;
  case RefAsId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::RefAs>(curr);
    return;
  case StringNewId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringNew>(curr);
    return;
  case StringConstId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringConst>(curr);
    return;
  case StringMeasureId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringMeasure>(curr);
    return;
  case StringEncodeId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringEncode>(curr);
    return;
  case StringConcatId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringConcat>(curr);
    return;
  case StringEqId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringEq>(curr);
    return;
  case StringAsId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringAs>(curr);
    return;
  case StringWTF8AdvanceId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringWTF8Advance>(curr);
    return;
  case StringWTF16GetId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringWTF16Get>(curr);
    return;
  case StringIterNextId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringIterNext>(curr);
    return;
  case StringIterMoveId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringIterMove>(curr);
    return;
  case StringSliceWTFId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringSliceWTF>(curr);
    return;
  case StringSliceIterId:
    local_30.this = (Fixer *)this;
    Expression::cast<wasm::StringSliceIter>(curr);
    return;
  default:
    goto switchD_0013f567_default;
  }
  fixAfterChanges::Fixer::visitExpression::anon_class_8_1_8991fb9c::operator()
            (&local_30,(Name *)pBVar4);
switchD_0013f567_default:
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (seen.count(name)) {
            replace();
          } else {
            seen.insert(name);
          }
        }
      });
      BranchUtils::operateOnScopeNameUses(curr, [&](Name& name) {
        if (name.is()) {
          replaceIfInvalid(name);
        }
      });
    }